

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O1

void Ivy_ObjConnect(Ivy_Man_t *p,Ivy_Obj_t *pObj,Ivy_Obj_t *pFan0,Ivy_Obj_t *pFan1)

{
  byte bVar1;
  Ivy_Obj_t *pIVar2;
  uint uVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x98,"void Ivy_ObjConnect(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  uVar3 = *(uint *)&pObj->field_0x8 & 0xf;
  bVar1 = 1;
  if (2 < uVar3 - 2) {
    if (uVar3 == 1) goto LAB_007a247e;
    if (uVar3 != 7) {
      bVar1 = 0;
    }
  }
  if (!(bool)(pFan1 != (Ivy_Obj_t *)0x0 | bVar1)) {
    __assert_fail("Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || pFan1 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyObj.c"
                  ,0x99,"void Ivy_ObjConnect(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
LAB_007a247e:
  pObj->pFanin0 = pFan0;
  pObj->pFanin1 = pFan1;
  pIVar2 = (Ivy_Obj_t *)((ulong)pFan0 & 0xfffffffffffffffe);
  if ((pIVar2 != (Ivy_Obj_t *)0x0) && (pIVar2->nRefs = pIVar2->nRefs + 1, p->fFanout != 0)) {
    Ivy_ObjAddFanout(p,pIVar2,pObj);
  }
  pIVar2 = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  if ((pIVar2 != (Ivy_Obj_t *)0x0) && (pIVar2->nRefs = pIVar2->nRefs + 1, p->fFanout != 0)) {
    Ivy_ObjAddFanout(p,pIVar2,pObj);
  }
  Ivy_TableInsert(p,pObj);
  return;
}

Assistant:

void Ivy_ObjConnect( Ivy_Man_t * p, Ivy_Obj_t * pObj, Ivy_Obj_t * pFan0, Ivy_Obj_t * pFan1 )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || pFan1 != NULL );
    // add the first fanin
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    // increment references of the fanins and add their fanouts
    if ( Ivy_ObjFanin0(pObj) != NULL )
    {
        Ivy_ObjRefsInc( Ivy_ObjFanin0(pObj) );
        if ( p->fFanout )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin0(pObj), pObj );
    }
    if ( Ivy_ObjFanin1(pObj) != NULL )
    {
        Ivy_ObjRefsInc( Ivy_ObjFanin1(pObj) );
        if ( p->fFanout )
            Ivy_ObjAddFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
    // add the node to the structural hash table
    Ivy_TableInsert( p, pObj );
}